

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O3

void helper_gvec_dup64_x86_64(void *d,uint32_t desc,uint64_t c)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  auVar2 = _DAT_00d58680;
  auVar1 = _DAT_00d58670;
  if (c == 0) {
    uVar5 = desc >> 2 & 0xf8;
    uVar4 = 0;
  }
  else {
    uVar3 = desc * 8 & 0xff;
    uVar4 = (ulong)(uVar3 + 8);
    uVar5 = desc & 0x1f;
    auVar7._4_4_ = 0;
    auVar7._0_4_ = uVar5;
    auVar7._8_4_ = uVar5;
    auVar7._12_4_ = 0;
    uVar6 = 0;
    auVar7 = auVar7 | _DAT_00d58680;
    do {
      auVar8._8_4_ = (int)uVar6;
      auVar8._0_8_ = uVar6;
      auVar8._12_4_ = (int)(uVar6 >> 0x20);
      auVar8 = (auVar8 | auVar1) ^ auVar2;
      if ((bool)(~(auVar8._4_4_ == auVar7._4_4_ && auVar7._0_4_ < auVar8._0_4_ ||
                  auVar7._4_4_ < auVar8._4_4_) & 1)) {
        *(uint64_t *)((long)d + uVar6 * 8) = c;
      }
      if ((auVar8._12_4_ != auVar7._12_4_ || auVar8._8_4_ <= auVar7._8_4_) &&
          auVar8._12_4_ <= auVar7._12_4_) {
        *(uint64_t *)((long)d + uVar6 * 8 + 8) = c;
      }
      uVar6 = uVar6 + 2;
    } while ((uVar5 + 2 & 0xfffffffe) != uVar6);
    uVar5 = desc >> 2 & 0xf8;
    if (uVar5 <= uVar3) {
      return;
    }
  }
  uVar6 = (ulong)(uVar5 + 8);
  if ((ulong)(uVar5 + 8) < uVar4 + 8) {
    uVar6 = uVar4 + 8;
  }
  memset((void *)((long)d + uVar4),0,(~uVar4 + uVar6 & 0xfffffffffffffff8) + 8);
  return;
}

Assistant:

void HELPER(gvec_dup64)(void *d, uint32_t desc, uint64_t c)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    if (c == 0) {
        oprsz = 0;
    } else {
        for (i = 0; i < oprsz; i += sizeof(uint64_t)) {
            *(uint64_t *)((char *)d + i) = c;
        }
    }
    clear_high(d, oprsz, desc);
}